

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

int redisAsyncCommandArgv
              (redisAsyncContext *ac,redisCallbackFn *fn,void *privdata,int argc,char **argv,
              size_t *argvlen)

{
  uint uVar1;
  int iVar2;
  sds cmd;
  char *local_40;
  void *local_38;
  
  local_38 = privdata;
  pthread_mutex_lock((pthread_mutex_t *)&ac->ctxlock);
  uVar1 = redisFormatSdsCommandArgv(&local_40,argc,argv,argvlen);
  if ((int)uVar1 < 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = __redisAsyncCommand(ac,fn,local_38,local_40,(ulong)uVar1);
    sdsfree(local_40);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&ac->ctxlock);
  return iVar2;
}

Assistant:

int redisAsyncCommandArgv(redisAsyncContext *ac, redisCallbackFn *fn, void *privdata, int argc, const char **argv, const size_t *argvlen) {
    pthread_mutex_lock(&ac->ctxlock);
    sds cmd;
    int len;
    int status;
    len = redisFormatSdsCommandArgv(&cmd,argc,argv,argvlen);
    if (len < 0){
        pthread_mutex_unlock(&ac->ctxlock);
        return REDIS_ERR;
    }

    status = __redisAsyncCommand(ac,fn,privdata,cmd,len);
    sdsfree(cmd);
    pthread_mutex_unlock(&ac->ctxlock);
    return status;
}